

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

void __thiscall QAbstractSpinBox::setLineEdit(QAbstractSpinBox *this,QLineEdit *lineEdit)

{
  bool bVar1;
  QAbstractSpinBoxPrivate *pQVar2;
  QValidator *pQVar3;
  QObject *pQVar4;
  QStyle *pQVar5;
  QLineEditPrivate *pQVar6;
  QLineEdit *in_RSI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QAbstractSpinBoxPrivate *d;
  QWidget *in_stack_fffffffffffffed8;
  undefined1 on;
  QWidget *in_stack_fffffffffffffee0;
  QWidget **in_stack_fffffffffffffee8;
  undefined1 enable;
  Connection *pCVar7;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  QWidget *in_stack_fffffffffffffef8;
  QWidget *in_stack_ffffffffffffff00;
  code *context;
  QWidget *in_stack_ffffffffffffff30;
  Object *in_stack_ffffffffffffff38;
  Object *in_stack_ffffffffffffff40;
  Object *sender;
  offset_in_QWidgetLineControl_to_subr slot;
  ConnectionType in_stack_ffffffffffffff80;
  Connection local_78 [2];
  Connection local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  Connection local_50;
  code *local_48;
  undefined8 uStack_40;
  Connection local_38;
  QLineEdit *local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QAbstractSpinBox *)0x686afe);
  if ((in_RSI != (QLineEdit *)0x0) && (in_RSI != pQVar2->edit)) {
    if (pQVar2->edit != (QLineEdit *)0x0) {
      (**(code **)(*(long *)&pQVar2->edit->super_QWidget + 0x20))();
    }
    pQVar2->edit = in_RSI;
    local_30 = pQVar2->edit;
    ::QVariant::fromValue<QWidget_*,_true>(in_stack_fffffffffffffee8);
    enable = (undefined1)((ulong)in_stack_fffffffffffffee8 >> 0x38);
    QObject::setProperty
              (&in_stack_fffffffffffffee0->super_QObject,(char *)in_stack_fffffffffffffed8,
               (QVariant *)0x686bb5);
    ::QVariant::~QVariant(&local_28);
    pQVar3 = QLineEdit::validator((QLineEdit *)in_stack_fffffffffffffee0);
    if (pQVar3 == (QValidator *)0x0) {
      QLineEdit::setValidator
                ((QLineEdit *)in_stack_fffffffffffffee0,(QValidator *)in_stack_fffffffffffffed8);
    }
    pQVar4 = QObject::parent((QObject *)0x686c13);
    if (pQVar4 != in_RDI) {
      QWidget::setParent(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    }
    pQVar5 = QWidget::style(in_stack_fffffffffffffed8);
    on = (undefined1)((ulong)in_stack_fffffffffffffed8 >> 0x38);
    (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0x73,0,in_RDI);
    QLineEdit::setFrame((QLineEdit *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                        (bool)enable);
    QWidget::setFocusProxy((QWidget *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    QWidget::setAcceptDrops(in_stack_fffffffffffffee0,(bool)on);
    if (pQVar2->type != UnknownType) {
      slot = 0;
      local_48 = QAbstractSpinBoxPrivate::editorTextChanged;
      uStack_40 = 0;
      pCVar7 = &local_38;
      in_stack_fffffffffffffef4 = 0;
      QObjectPrivate::
      connect<void(QLineEdit::*)(QString_const&),void(QAbstractSpinBoxPrivate::*)(QString_const&)>
                (in_stack_ffffffffffffff40,(offset_in_QLineEdit_to_subr)in_RSI,
                 in_stack_ffffffffffffff38,0,
                 (ConnectionType)((ulong)in_stack_ffffffffffffff30 >> 0x20));
      QMetaObject::Connection::~Connection(pCVar7);
      context = QLineEdit::cursorPositionChanged;
      uStack_58 = 0;
      local_60 = 0xe9;
      pCVar7 = &local_50;
      QObjectPrivate::connect<void(QLineEdit::*)(int,int),void(QAbstractSpinBoxPrivate::*)(int,int)>
                (in_stack_ffffffffffffff40,(offset_in_QLineEdit_to_subr)in_RSI,
                 in_stack_ffffffffffffff38,slot,
                 (ConnectionType)((ulong)in_stack_ffffffffffffff30 >> 0x20));
      QMetaObject::Connection::~Connection(pCVar7);
      sender = (Object *)0x0;
      QObject::connect<void(QLineEdit::*)(int,int),QAbstractSpinBox::setLineEdit(QLineEdit*)::__0>
                ((Object *)0x0,slot,(ContextType *)context,
                 (anon_class_8_1_8991fb9c_for_o *)in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff80);
      QMetaObject::Connection::~Connection(&local_68);
      QLineEdit::d_func((QLineEdit *)0x686e49);
      QObject::connect<void(QWidgetLineControl::*)(),QAbstractSpinBox::setLineEdit(QLineEdit*)::__1>
                (sender,slot,(ContextType *)context,(anon_class_8_1_8991fb9c_for_o *)0x0,
                 (ConnectionType)in_RDI);
      QMetaObject::Connection::~Connection(local_78);
    }
    (**(code **)(*(long *)&pQVar2->super_QWidgetPrivate + 0x100))();
    QWidget::setContextMenuPolicy(&pQVar2->edit->super_QWidget,NoContextMenu);
    pQVar6 = QLineEdit::d_func((QLineEdit *)0x686ee2);
    QWidgetLineControl::setAccessibleObject((QWidgetLineControl *)pQVar6->control,in_RDI);
    bVar1 = QWidget::isVisible((QWidget *)0x686efd);
    if (bVar1) {
      QWidget::show((QWidget *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    }
    bVar1 = QWidget::isVisible((QWidget *)0x686f21);
    if (bVar1) {
      (**(code **)(*(long *)&pQVar2->super_QWidgetPrivate + 0xc0))();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractSpinBox::setLineEdit(QLineEdit *lineEdit)
{
    Q_D(QAbstractSpinBox);

    if (!lineEdit) {
        Q_ASSERT(lineEdit);
        return;
    }

    if (lineEdit == d->edit)
        return;

    delete d->edit;
    d->edit = lineEdit;
    setProperty("_q_spinbox_lineedit", QVariant::fromValue<QWidget *>(d->edit));
    if (!d->edit->validator())
        d->edit->setValidator(d->validator);

    if (d->edit->parent() != this)
        d->edit->setParent(this);

    d->edit->setFrame(!style()->styleHint(QStyle::SH_SpinBox_ButtonsInsideFrame, nullptr, this));
    d->edit->setFocusProxy(this);
    d->edit->setAcceptDrops(false);

    if (d->type != QMetaType::UnknownType) {
        QObjectPrivate::connect(d->edit, &QLineEdit::textChanged,
                                d, &QAbstractSpinBoxPrivate::editorTextChanged);
        QObjectPrivate::connect(d->edit, &QLineEdit::cursorPositionChanged,
                                d, &QAbstractSpinBoxPrivate::editorCursorPositionChanged);
        connect(d->edit, &QLineEdit::cursorPositionChanged,
                this, [this]() { updateMicroFocus(); });
        connect(d->edit->d_func()->control, &QWidgetLineControl::updateMicroFocus,
                this, [this]() { updateMicroFocus(); });
    }
    d->updateEditFieldGeometry();
    d->edit->setContextMenuPolicy(Qt::NoContextMenu);
    d->edit->d_func()->control->setAccessibleObject(this);

    if (isVisible())
        d->edit->show();
    if (isVisible())
        d->updateEdit();
}